

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O0

bool jaegertracing::operator==(SpanContext *lhs,SpanContext *rhs)

{
  bool bVar1;
  __type _Var2;
  __type local_52;
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> rhsLock;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lhsLock;
  SpanContext *rhs_local;
  SpanContext *lhs_local;
  
  lhsLock._M_device = (mutex_type *)rhs;
  std::lock<std::mutex,std::mutex>(&lhs->_mutex,&rhs->_mutex);
  std::lock_guard<std::mutex>::lock_guard(&local_28,&lhs->_mutex);
  std::lock_guard<std::mutex>::lock_guard
            (&local_38,(undefined1 *)((long)&lhsLock._M_device[4].super___mutex_base._M_mutex + 8));
  bVar1 = std::operator!=(&lhs->_baggage,
                          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)&lhsLock._M_device[1].super___mutex_base._M_mutex + 8));
  if (bVar1) {
    lhs_local._7_1_ = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  if (!bVar1) {
    bVar1 = TraceID::operator==(&lhs->_traceID,
                                (TraceID *)
                                ((long)&((lhsLock._M_device)->super___mutex_base)._M_mutex + 8));
    local_52 = false;
    if ((((bVar1) &&
         (local_52 = false,
         (__pthread_internal_list *)lhs->_spanID ==
         ((lhsLock._M_device)->super___mutex_base)._M_mutex.__data.__list.__prev)) &&
        (local_52 = false,
        (__pthread_internal_list *)lhs->_parentID ==
        ((lhsLock._M_device)->super___mutex_base)._M_mutex.__data.__list.__next)) &&
       (local_52 = false, lhs->_flags == lhsLock._M_device[1].super___mutex_base._M_mutex.__size[0])
       ) {
      _Var2 = std::operator==(&lhs->_debugID,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &lhsLock._M_device[2].super___mutex_base._M_mutex.__data.__list);
      local_52 = false;
      if (_Var2) {
        local_52 = std::operator==(&lhs->_traceState,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&lhsLock._M_device[3].super___mutex_base._M_mutex +
                                      0x10));
      }
    }
    lhs_local._7_1_ = local_52;
  }
  return (bool)(lhs_local._7_1_ & 1);
}

Assistant:

bool operator==(const SpanContext& lhs, const SpanContext& rhs)
    {
        {
            std::lock(lhs._mutex, rhs._mutex);
            std::lock_guard<std::mutex> lhsLock(lhs._mutex, std::adopt_lock);
            std::lock_guard<std::mutex> rhsLock(rhs._mutex, std::adopt_lock);
            if (lhs._baggage != rhs._baggage) {
                return false;
            }
        }
        return lhs._traceID == rhs._traceID && lhs._spanID == rhs._spanID &&
               lhs._parentID == rhs._parentID && lhs._flags == rhs._flags &&
               lhs._debugID == rhs._debugID &&
               lhs._traceState == rhs._traceState;
    }